

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroidtracker.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
centroidtracker::cdist
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,centroidtracker *this,
          vector<centroid,_std::allocator<centroid>_> *data_1,
          vector<centroid,_std::allocator<centroid>_> *data_2)

{
  centroid pts1;
  centroid pts2;
  const_reference pvVar1;
  int j;
  ulong __n;
  ulong __n_00;
  vector<double,_std::allocator<double>_> result_row;
  double local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__n_00 = 0;
      __n_00 < (ulong)((long)(data_1->super__Vector_base<centroid,_std::allocator<centroid>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(data_1->super__Vector_base<centroid,_std::allocator<centroid>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 3); __n_00 = __n_00 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (__n = 0; __n < (ulong)((long)(data_2->
                                      super__Vector_base<centroid,_std::allocator<centroid>_>).
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)(data_2->
                                      super__Vector_base<centroid,_std::allocator<centroid>_>).
                                      _M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
    {
      pvVar1 = std::vector<centroid,_std::allocator<centroid>_>::at(data_1,__n_00);
      pts1.x = pvVar1->x;
      pts1.y = pvVar1->y;
      pvVar1 = std::vector<centroid,_std::allocator<centroid>_>::at(data_2,__n);
      pts2.x = pvVar1->x;
      pts2.y = pvVar1->y;
      local_50 = distanceOfPts(pts1,pts2);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_48,&local_50);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double>> centroidtracker::cdist(const std::vector<centroid> data_1, const std::vector<centroid> data_2) {
	std::vector<std::vector<double>> result;
	for (int i = 0; i < data_1.size(); ++i) {
		std::vector<double> result_row;
		for (int j = 0; j < data_2.size(); ++j) {
			result_row.push_back(distanceOfPts(data_1.at(i), data_2.at(j)));
		}
		result.push_back(result_row);
	}
	return result;
}